

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__add_section(char *buffer,char *data,int curlen,int newlen)

{
  int iVar1;
  int z2;
  int z1;
  int newlen_local;
  int curlen_local;
  char *data_local;
  char *buffer_local;
  
  if (newlen < curlen) {
    iVar1 = newlen >> 1;
    memcpy(buffer,data,(long)(iVar1 + -1));
    buffer[iVar1 + -1] = '.';
    buffer[iVar1] = '.';
    memcpy(buffer + (long)iVar1 + 1,data + ((long)curlen - (long)(newlen - iVar1)) + 1,
           (long)((newlen - iVar1) + -1));
  }
  else {
    memcpy(buffer,data,(long)curlen);
  }
  return;
}

Assistant:

void stb__add_section(char *buffer, char *data, int curlen, int newlen)
{
   if (newlen < curlen) {
      int z1 = newlen >> 1, z2 = newlen-z1;
      memcpy(buffer, data, z1-1);
      buffer[z1-1] = '.';
      buffer[z1-0] = '.';
      memcpy(buffer+z1+1, data+curlen-z2+1, z2-1);
   } else
      memcpy(buffer, data, curlen);
}